

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O2

void __thiscall
dg::vr::ValueRelations::RelatedValueIterator::RelatedValueIterator
          (RelatedValueIterator *this,ValueRelations *v,Handle start,Relations *allowedEdges)

{
  VectorSet<const_llvm::Value_*> *pVVar1;
  
  this->vr = v;
  RelationsGraph<dg::vr::ValueRelations>::getRelated
            (&this->related,&v->graph,start,allowedEdges,false);
  (this->bucketIt)._M_node = (this->related)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pVVar1 = getCurrentEqual(this);
  (this->valueIt)._M_current =
       (pVVar1->vec).super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->current).first = (Value *)0x0;
  (this->current).second.bits.super__Base_bitset<1UL>._M_w = 0;
  this->isEnd = false;
  nextViableValue(this);
  return;
}

Assistant:

RelatedValueIterator(const ValueRelations &v, Handle start,
                             const Relations &allowedEdges)
                : vr(v), related(vr.graph.getRelated(start, allowedEdges)),
                  bucketIt(related.begin()),
                  valueIt(getCurrentEqual().begin()) {
            assert(allowedEdges.has(Relations::EQ) &&
                   "at least one related bucket");
            nextViableValue();
        }